

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-async.c++
# Opt level: O0

ssize_t __thiscall
capnp::anon_unknown_0::AsyncMessageReader::read
          (AsyncMessageReader *this,int __fd,void *__buf,size_t __nbytes)

{
  undefined4 in_register_00000034;
  AsyncInputStream *local_30;
  AsyncInputStream *inputStream_local;
  AsyncMessageReader *this_local;
  ArrayPtr<capnp::word> scratchSpace_local;
  
  inputStream_local = (AsyncInputStream *)CONCAT44(in_register_00000034,__fd);
  local_30 = (AsyncInputStream *)__buf;
  this_local = (AsyncMessageReader *)__nbytes;
  scratchSpace_local.size_ = (size_t)this;
  (**(code **)(*__buf + 8))
            ((Type *)&stack0xffffffffffffffc8,__buf,
             (undefined1 *)((long)&inputStream_local[0x19]._vptr_AsyncInputStream + 4),8);
  kj::Promise<unsigned_long>::
  then<capnp::(anonymous_namespace)::AsyncMessageReader::read(kj::AsyncInputStream&,kj::ArrayPtr<capnp::word>)::__0>
            ((Promise<unsigned_long> *)this,(Type *)&stack0xffffffffffffffc8);
  kj::Promise<unsigned_long>::~Promise((Promise<unsigned_long> *)&stack0xffffffffffffffc8);
  return (ssize_t)this;
}

Assistant:

kj::Promise<bool> AsyncMessageReader::read(kj::AsyncInputStream& inputStream,
                                           kj::ArrayPtr<word> scratchSpace) {
  return inputStream.tryRead(firstWord, sizeof(firstWord), sizeof(firstWord))
      .then([this,&inputStream,KJ_CPCAP(scratchSpace)](size_t n) mutable -> kj::Promise<bool> {
    if (n == 0) {
      return false;
    } else if (n < sizeof(firstWord)) {
      // EOF in first word.
      kj::throwRecoverableException(KJ_EXCEPTION(DISCONNECTED, "Premature EOF."));
      return false;
    }

    return readAfterFirstWord(inputStream, scratchSpace).then([]() { return true; });
  });
}